

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

LValue * __thiscall
slang::ast::NamedValueExpression::evalLValueImpl(NamedValueExpression *this,EvalContext *context)

{
  string_view arg;
  undefined1 auVar1 [16];
  bool bVar2;
  ConstantValue *pCVar3;
  ulong in_RDX;
  SourceLocation in_RSI;
  Diagnostic *in_RDI;
  Diagnostic *diag;
  ConstantValue *cv;
  EvalContext *in_stack_00000090;
  NamedValueExpression *in_stack_00000098;
  ConstantValue *in_stack_00000108;
  LValue *in_stack_00000110;
  Diagnostic *this_00;
  ValueSymbol *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar4;
  EvalContext *in_stack_ffffffffffffffd8;
  SourceLocation SVar5;
  DiagCode code;
  
  this_00 = in_RDI;
  SVar5 = in_RSI;
  bVar2 = checkConstant(in_stack_00000098,in_stack_00000090);
  code = SVar5._4_4_;
  if (bVar2) {
    pCVar3 = EvalContext::findLocal
                       ((EvalContext *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                        ,in_stack_ffffffffffffffa0);
    if (pCVar3 == (ConstantValue *)0x0) {
      uVar4 = 0x15000c;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = in_RDX;
      EvalContext::addDiag(in_stack_ffffffffffffffd8,code,(SourceRange)(auVar1 << 0x40));
      arg._M_str = (char *)pCVar3;
      arg._M_len = (size_t)in_stack_ffffffffffffffd8;
      Diagnostic::operator<<((Diagnostic *)CONCAT44(uVar4,in_stack_ffffffffffffffd0),arg);
      Diagnostic::addNote(this_00,SUB84((ulong)*(undefined8 *)
                                                (*(long *)((long)in_RSI + 0x30) + 0x18) >> 0x20,0),
                          in_RSI);
      LValue::LValue((LValue *)this_00,in_RDI);
    }
    else {
      LValue::LValue(in_stack_00000110,in_stack_00000108);
    }
  }
  else {
    LValue::LValue((LValue *)this_00,in_RDI);
  }
  return (LValue *)this_00;
}

Assistant:

LValue NamedValueExpression::evalLValueImpl(EvalContext& context) const {
    if (!checkConstant(context))
        return nullptr;

    auto cv = context.findLocal(&symbol);
    if (!cv) {
        auto& diag = context.addDiag(diag::ConstEvalNonConstVariable, sourceRange) << symbol.name;
        diag.addNote(diag::NoteDeclarationHere, symbol.location);
        return nullptr;
    }

    return LValue(*cv);
}